

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::LogicalType::LogicalType(LogicalType *this,LogicalType *other52)

{
  _TimeUnit__isset *p_Var1;
  int32_t iVar2;
  
  *(undefined ***)this = &PTR__LogicalType_019dd058;
  this->STRING = (StringType)&PTR__StringType_019dc908;
  this->MAP = (MapType)&PTR__MapType_019dc9d8;
  this->LIST = (ListType)&PTR__ListType_019dca40;
  this->ENUM = (EnumType)&PTR__EnumType_019dcaa8;
  *(undefined ***)&this->DECIMAL = &PTR__DecimalType_019dcc48;
  (this->DECIMAL).scale = 0;
  (this->DECIMAL).precision = 0;
  this->DATE = (DateType)&PTR__DateType_019dcb10;
  *(undefined ***)&this->TIME = &PTR__TimeType_019dceb8;
  (this->TIME).isAdjustedToUTC = false;
  *(undefined ***)&(this->TIME).unit = &PTR__TimeUnit_019dcde8;
  (this->TIME).unit.MILLIS = (MilliSeconds)&PTR__MilliSeconds_019dccb0;
  (this->TIME).unit.MICROS = (MicroSeconds)&PTR__MicroSeconds_019dcd18;
  (this->TIME).unit.NANOS = (NanoSeconds)&PTR__NanoSeconds_019dcd80;
  p_Var1 = &(this->TIME).unit.__isset;
  *p_Var1 = (_TimeUnit__isset)((byte)*p_Var1 & 0xf8);
  *(undefined ***)&this->TIMESTAMP = &PTR__TimestampType_019dce50;
  (this->TIMESTAMP).isAdjustedToUTC = false;
  *(undefined ***)&(this->TIMESTAMP).unit = &PTR__TimeUnit_019dcde8;
  (this->TIMESTAMP).unit.MILLIS = (MilliSeconds)&PTR__MilliSeconds_019dccb0;
  (this->TIMESTAMP).unit.MICROS = (MicroSeconds)&PTR__MicroSeconds_019dcd18;
  (this->TIMESTAMP).unit.NANOS = (NanoSeconds)&PTR__NanoSeconds_019dcd80;
  p_Var1 = &(this->TIMESTAMP).unit.__isset;
  *p_Var1 = (_TimeUnit__isset)((byte)*p_Var1 & 0xf8);
  *(undefined ***)&this->INTEGER = &PTR__IntType_019dcf20;
  (this->INTEGER).bitWidth = '\0';
  (this->INTEGER).isSigned = false;
  this->UNKNOWN = (NullType)&PTR__NullType_019dcbe0;
  this->JSON = (JsonType)&PTR__JsonType_019dcf88;
  this->BSON = (BsonType)&PTR__BsonType_019dcff0;
  this->UUID = (UUIDType)&PTR__UUIDType_019dc970;
  this->FLOAT16 = (Float16Type)&PTR__Float16Type_019dcb78;
  this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xc000);
  iVar2 = (other52->DECIMAL).precision;
  (this->DECIMAL).scale = (other52->DECIMAL).scale;
  (this->DECIMAL).precision = iVar2;
  (this->TIME).isAdjustedToUTC = (other52->TIME).isAdjustedToUTC;
  (this->TIME).unit.__isset = (other52->TIME).unit.__isset;
  (this->TIMESTAMP).isAdjustedToUTC = (other52->TIMESTAMP).isAdjustedToUTC;
  (this->TIMESTAMP).unit.__isset = (other52->TIMESTAMP).unit.__isset;
  (this->INTEGER).bitWidth = (other52->INTEGER).bitWidth;
  (this->INTEGER).isSigned = (other52->INTEGER).isSigned;
  this->__isset = other52->__isset;
  return;
}

Assistant:

LogicalType::LogicalType(const LogicalType& other52) noexcept {
  STRING = other52.STRING;
  MAP = other52.MAP;
  LIST = other52.LIST;
  ENUM = other52.ENUM;
  DECIMAL = other52.DECIMAL;
  DATE = other52.DATE;
  TIME = other52.TIME;
  TIMESTAMP = other52.TIMESTAMP;
  INTEGER = other52.INTEGER;
  UNKNOWN = other52.UNKNOWN;
  JSON = other52.JSON;
  BSON = other52.BSON;
  UUID = other52.UUID;
  FLOAT16 = other52.FLOAT16;
  __isset = other52.__isset;
}